

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractDemuxer.h
# Opt level: O0

void __thiscall AbstractDemuxer::AbstractDemuxer(AbstractDemuxer *this)

{
  AbstractDemuxer *this_local;
  
  this->_vptr_AbstractDemuxer = (_func_int **)&PTR__AbstractDemuxer_0043fd20;
  std::
  map<int,_SubTrackFilter_*,_std::less<int>,_std::allocator<std::pair<const_int,_SubTrackFilter_*>_>_>
  ::map(&this->m_pidFilters);
  this->m_fileBlockSize = 0x200000;
  this->m_timeOffset = 0;
  return;
}

Assistant:

AbstractDemuxer()
    {
        m_fileBlockSize = DEFAULT_FILE_BLOCK_SIZE;
        m_timeOffset = 0;
    }